

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<double> read_real(string_view buf)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined8 uVar2;
  ptrdiff_t _Num;
  ulong __n;
  _Storage<double,_true> in_XMM0_Qa;
  string_view rhs;
  optional<double> oVar3;
  double result;
  char buffer [320];
  
  __n = buf._M_len;
  if (__n < 3) {
    buffer[0x100] = '\0';
    buffer[0x101] = '\0';
    buffer[0x102] = '\0';
    buffer[0x103] = '\0';
    buffer[0x104] = '\0';
    buffer[0x105] = '\0';
    buffer[0x106] = '\0';
    buffer[0x107] = '\0';
    buffer[0x108] = '\0';
    buffer[0x109] = '\0';
    buffer[0x10a] = '\0';
    buffer[0x10b] = '\0';
    buffer[0x10c] = '\0';
    buffer[0x10d] = '\0';
    buffer[0x10e] = '\0';
    buffer[0x10f] = '\0';
    buffer[0x110] = '\0';
    buffer[0x111] = '\0';
    buffer[0x112] = '\0';
    buffer[0x113] = '\0';
    buffer[0x114] = '\0';
    buffer[0x115] = '\0';
    buffer[0x116] = '\0';
    buffer[0x117] = '\0';
    buffer[0x118] = '\0';
    buffer[0x119] = '\0';
    buffer[0x11a] = '\0';
    buffer[0x11b] = '\0';
    buffer[0x11c] = '\0';
    buffer[0x11d] = '\0';
    buffer[0x11e] = '\0';
    buffer[0x11f] = '\0';
    buffer[0x120] = '\0';
    buffer[0x121] = '\0';
    buffer[0x122] = '\0';
    buffer[0x123] = '\0';
    buffer[0x124] = '\0';
    buffer[0x125] = '\0';
    buffer[0x126] = '\0';
    buffer[0x127] = '\0';
    buffer[0x128] = '\0';
    buffer[0x129] = '\0';
    buffer[0x12a] = '\0';
    buffer[299] = '\0';
    buffer[300] = '\0';
    buffer[0x12d] = '\0';
    buffer[0x12e] = '\0';
    buffer[0x12f] = '\0';
    buffer[0x130] = '\0';
    buffer[0x131] = '\0';
    buffer[0x132] = '\0';
    buffer[0x133] = '\0';
    buffer[0x134] = '\0';
    buffer[0x135] = '\0';
    buffer[0x136] = '\0';
    buffer[0x137] = '\0';
    buffer[0x138] = '\0';
    buffer[0x139] = '\0';
    buffer[0x13a] = '\0';
    buffer[0x13b] = '\0';
    buffer[0x13c] = '\0';
    buffer[0x13d] = '\0';
    buffer[0x13e] = '\0';
    buffer[0x13f] = '\0';
    buffer[0xc0] = '\0';
    buffer[0xc1] = '\0';
    buffer[0xc2] = '\0';
    buffer[0xc3] = '\0';
    buffer[0xc4] = '\0';
    buffer[0xc5] = '\0';
    buffer[0xc6] = '\0';
    buffer[199] = '\0';
    buffer[200] = '\0';
    buffer[0xc9] = '\0';
    buffer[0xca] = '\0';
    buffer[0xcb] = '\0';
    buffer[0xcc] = '\0';
    buffer[0xcd] = '\0';
    buffer[0xce] = '\0';
    buffer[0xcf] = '\0';
    buffer[0xd0] = '\0';
    buffer[0xd1] = '\0';
    buffer[0xd2] = '\0';
    buffer[0xd3] = '\0';
    buffer[0xd4] = '\0';
    buffer[0xd5] = '\0';
    buffer[0xd6] = '\0';
    buffer[0xd7] = '\0';
    buffer[0xd8] = '\0';
    buffer[0xd9] = '\0';
    buffer[0xda] = '\0';
    buffer[0xdb] = '\0';
    buffer[0xdc] = '\0';
    buffer[0xdd] = '\0';
    buffer[0xde] = '\0';
    buffer[0xdf] = '\0';
    buffer[0xe0] = '\0';
    buffer[0xe1] = '\0';
    buffer[0xe2] = '\0';
    buffer[0xe3] = '\0';
    buffer[0xe4] = '\0';
    buffer[0xe5] = '\0';
    buffer[0xe6] = '\0';
    buffer[0xe7] = '\0';
    buffer[0xe8] = '\0';
    buffer[0xe9] = '\0';
    buffer[0xea] = '\0';
    buffer[0xeb] = '\0';
    buffer[0xec] = '\0';
    buffer[0xed] = '\0';
    buffer[0xee] = '\0';
    buffer[0xef] = '\0';
    buffer[0xf0] = '\0';
    buffer[0xf1] = '\0';
    buffer[0xf2] = '\0';
    buffer[0xf3] = '\0';
    buffer[0xf4] = '\0';
    buffer[0xf5] = '\0';
    buffer[0xf6] = '\0';
    buffer[0xf7] = '\0';
    buffer[0xf8] = '\0';
    buffer[0xf9] = '\0';
    buffer[0xfa] = '\0';
    buffer[0xfb] = '\0';
    buffer[0xfc] = '\0';
    buffer[0xfd] = '\0';
    buffer[0xfe] = '\0';
    buffer[0xff] = '\0';
    buffer[0x80] = '\0';
    buffer[0x81] = '\0';
    buffer[0x82] = '\0';
    buffer[0x83] = '\0';
    buffer[0x84] = '\0';
    buffer[0x85] = '\0';
    buffer[0x86] = '\0';
    buffer[0x87] = '\0';
    buffer[0x88] = '\0';
    buffer[0x89] = '\0';
    buffer[0x8a] = '\0';
    buffer[0x8b] = '\0';
    buffer[0x8c] = '\0';
    buffer[0x8d] = '\0';
    buffer[0x8e] = '\0';
    buffer[0x8f] = '\0';
    buffer[0x90] = '\0';
    buffer[0x91] = '\0';
    buffer[0x92] = '\0';
    buffer[0x93] = '\0';
    buffer[0x94] = '\0';
    buffer[0x95] = '\0';
    buffer[0x96] = '\0';
    buffer[0x97] = '\0';
    buffer[0x98] = '\0';
    buffer[0x99] = '\0';
    buffer[0x9a] = '\0';
    buffer[0x9b] = '\0';
    buffer[0x9c] = '\0';
    buffer[0x9d] = '\0';
    buffer[0x9e] = '\0';
    buffer[0x9f] = '\0';
    buffer[0xa0] = '\0';
    buffer[0xa1] = '\0';
    buffer[0xa2] = '\0';
    buffer[0xa3] = '\0';
    buffer[0xa4] = '\0';
    buffer[0xa5] = '\0';
    buffer[0xa6] = '\0';
    buffer[0xa7] = '\0';
    buffer[0xa8] = '\0';
    buffer[0xa9] = '\0';
    buffer[0xaa] = '\0';
    buffer[0xab] = '\0';
    buffer[0xac] = '\0';
    buffer[0xad] = '\0';
    buffer[0xae] = '\0';
    buffer[0xaf] = '\0';
    buffer[0xb0] = '\0';
    buffer[0xb1] = '\0';
    buffer[0xb2] = '\0';
    buffer[0xb3] = '\0';
    buffer[0xb4] = '\0';
    buffer[0xb5] = '\0';
    buffer[0xb6] = '\0';
    buffer[0xb7] = '\0';
    buffer[0xb8] = '\0';
    buffer[0xb9] = '\0';
    buffer[0xba] = '\0';
    buffer[0xbb] = '\0';
    buffer[0xbc] = '\0';
    buffer[0xbd] = '\0';
    buffer[0xbe] = '\0';
    buffer[0xbf] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    if (__n != 0) goto LAB_00129448;
  }
  else {
    rhs._M_str = "inf";
    rhs._M_len = 3;
    result = in_XMM0_Qa._M_value;
    bVar1 = are_equal(buf,rhs);
    if (bVar1) {
      result = INFINITY;
      uVar2 = CONCAT71(extraout_var,1);
      goto LAB_0012948b;
    }
    if (0x140 < __n) {
      uVar2 = 0;
      goto LAB_0012948b;
    }
LAB_00129448:
    buffer[0x138] = '\0';
    buffer[0x139] = '\0';
    buffer[0x13a] = '\0';
    buffer[0x13b] = '\0';
    buffer[0x13c] = '\0';
    buffer[0x13d] = '\0';
    buffer[0x13e] = '\0';
    buffer[0x13f] = '\0';
    buffer[0x130] = '\0';
    buffer[0x131] = '\0';
    buffer[0x132] = '\0';
    buffer[0x133] = '\0';
    buffer[0x134] = '\0';
    buffer[0x135] = '\0';
    buffer[0x136] = '\0';
    buffer[0x137] = '\0';
    buffer[0x128] = '\0';
    buffer[0x129] = '\0';
    buffer[0x12a] = '\0';
    buffer[299] = '\0';
    buffer[300] = '\0';
    buffer[0x12d] = '\0';
    buffer[0x12e] = '\0';
    buffer[0x12f] = '\0';
    buffer[0x120] = '\0';
    buffer[0x121] = '\0';
    buffer[0x122] = '\0';
    buffer[0x123] = '\0';
    buffer[0x124] = '\0';
    buffer[0x125] = '\0';
    buffer[0x126] = '\0';
    buffer[0x127] = '\0';
    buffer[0x118] = '\0';
    buffer[0x119] = '\0';
    buffer[0x11a] = '\0';
    buffer[0x11b] = '\0';
    buffer[0x11c] = '\0';
    buffer[0x11d] = '\0';
    buffer[0x11e] = '\0';
    buffer[0x11f] = '\0';
    buffer[0x110] = '\0';
    buffer[0x111] = '\0';
    buffer[0x112] = '\0';
    buffer[0x113] = '\0';
    buffer[0x114] = '\0';
    buffer[0x115] = '\0';
    buffer[0x116] = '\0';
    buffer[0x117] = '\0';
    buffer[0x108] = '\0';
    buffer[0x109] = '\0';
    buffer[0x10a] = '\0';
    buffer[0x10b] = '\0';
    buffer[0x10c] = '\0';
    buffer[0x10d] = '\0';
    buffer[0x10e] = '\0';
    buffer[0x10f] = '\0';
    buffer[0x100] = '\0';
    buffer[0x101] = '\0';
    buffer[0x102] = '\0';
    buffer[0x103] = '\0';
    buffer[0x104] = '\0';
    buffer[0x105] = '\0';
    buffer[0x106] = '\0';
    buffer[0x107] = '\0';
    buffer[0xf8] = '\0';
    buffer[0xf9] = '\0';
    buffer[0xfa] = '\0';
    buffer[0xfb] = '\0';
    buffer[0xfc] = '\0';
    buffer[0xfd] = '\0';
    buffer[0xfe] = '\0';
    buffer[0xff] = '\0';
    buffer[0xf0] = '\0';
    buffer[0xf1] = '\0';
    buffer[0xf2] = '\0';
    buffer[0xf3] = '\0';
    buffer[0xf4] = '\0';
    buffer[0xf5] = '\0';
    buffer[0xf6] = '\0';
    buffer[0xf7] = '\0';
    buffer[0xe8] = '\0';
    buffer[0xe9] = '\0';
    buffer[0xea] = '\0';
    buffer[0xeb] = '\0';
    buffer[0xec] = '\0';
    buffer[0xed] = '\0';
    buffer[0xee] = '\0';
    buffer[0xef] = '\0';
    buffer[0xe0] = '\0';
    buffer[0xe1] = '\0';
    buffer[0xe2] = '\0';
    buffer[0xe3] = '\0';
    buffer[0xe4] = '\0';
    buffer[0xe5] = '\0';
    buffer[0xe6] = '\0';
    buffer[0xe7] = '\0';
    buffer[0xd8] = '\0';
    buffer[0xd9] = '\0';
    buffer[0xda] = '\0';
    buffer[0xdb] = '\0';
    buffer[0xdc] = '\0';
    buffer[0xdd] = '\0';
    buffer[0xde] = '\0';
    buffer[0xdf] = '\0';
    buffer[0xd0] = '\0';
    buffer[0xd1] = '\0';
    buffer[0xd2] = '\0';
    buffer[0xd3] = '\0';
    buffer[0xd4] = '\0';
    buffer[0xd5] = '\0';
    buffer[0xd6] = '\0';
    buffer[0xd7] = '\0';
    buffer[200] = '\0';
    buffer[0xc9] = '\0';
    buffer[0xca] = '\0';
    buffer[0xcb] = '\0';
    buffer[0xcc] = '\0';
    buffer[0xcd] = '\0';
    buffer[0xce] = '\0';
    buffer[0xcf] = '\0';
    buffer[0xc0] = '\0';
    buffer[0xc1] = '\0';
    buffer[0xc2] = '\0';
    buffer[0xc3] = '\0';
    buffer[0xc4] = '\0';
    buffer[0xc5] = '\0';
    buffer[0xc6] = '\0';
    buffer[199] = '\0';
    buffer[0xb8] = '\0';
    buffer[0xb9] = '\0';
    buffer[0xba] = '\0';
    buffer[0xbb] = '\0';
    buffer[0xbc] = '\0';
    buffer[0xbd] = '\0';
    buffer[0xbe] = '\0';
    buffer[0xbf] = '\0';
    buffer[0xb0] = '\0';
    buffer[0xb1] = '\0';
    buffer[0xb2] = '\0';
    buffer[0xb3] = '\0';
    buffer[0xb4] = '\0';
    buffer[0xb5] = '\0';
    buffer[0xb6] = '\0';
    buffer[0xb7] = '\0';
    buffer[0xa8] = '\0';
    buffer[0xa9] = '\0';
    buffer[0xaa] = '\0';
    buffer[0xab] = '\0';
    buffer[0xac] = '\0';
    buffer[0xad] = '\0';
    buffer[0xae] = '\0';
    buffer[0xaf] = '\0';
    buffer[0xa0] = '\0';
    buffer[0xa1] = '\0';
    buffer[0xa2] = '\0';
    buffer[0xa3] = '\0';
    buffer[0xa4] = '\0';
    buffer[0xa5] = '\0';
    buffer[0xa6] = '\0';
    buffer[0xa7] = '\0';
    buffer[0x98] = '\0';
    buffer[0x99] = '\0';
    buffer[0x9a] = '\0';
    buffer[0x9b] = '\0';
    buffer[0x9c] = '\0';
    buffer[0x9d] = '\0';
    buffer[0x9e] = '\0';
    buffer[0x9f] = '\0';
    buffer[0x90] = '\0';
    buffer[0x91] = '\0';
    buffer[0x92] = '\0';
    buffer[0x93] = '\0';
    buffer[0x94] = '\0';
    buffer[0x95] = '\0';
    buffer[0x96] = '\0';
    buffer[0x97] = '\0';
    buffer[0x88] = '\0';
    buffer[0x89] = '\0';
    buffer[0x8a] = '\0';
    buffer[0x8b] = '\0';
    buffer[0x8c] = '\0';
    buffer[0x8d] = '\0';
    buffer[0x8e] = '\0';
    buffer[0x8f] = '\0';
    buffer[0x80] = '\0';
    buffer[0x81] = '\0';
    buffer[0x82] = '\0';
    buffer[0x83] = '\0';
    buffer[0x84] = '\0';
    buffer[0x85] = '\0';
    buffer[0x86] = '\0';
    buffer[0x87] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    memcpy(buffer,buf._M_str,__n);
  }
  buffer[__n] = '\0';
  result = 0.0;
  uVar2 = __isoc99_sscanf(buffer,"%lf",&result);
  uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),0 < (int)uVar2);
LAB_0012948b:
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = uVar2;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = result;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double>
read_real(const std::string_view buf) noexcept
{
    if (buf.size() >= 3 && are_equal(buf, "inf"))
        return std::numeric_limits<double>::infinity();

    constexpr std::size_t max_digits = 320;
    if (buf.size() > max_digits)
        return std::nullopt;

    char buffer[max_digits] = { '\0' };
    std::copy_n(buf.data(), buf.size(), std::begin(buffer));
    buffer[buf.size()] = '\0';

    double result = 0;
    if (auto read = std::sscanf(buffer, "%lf", &result); read > 0)
        return result;
    else
        return std::nullopt;
}